

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_decode_tip_pgd(pt_event_decoder *decoder,pt_packet_ip *packet)

{
  pt_config *config;
  pt_event *ppVar1;
  uint64_t at;
  int errcode;
  pt_event *ev;
  pt_packet_ip *packet_local;
  pt_event_decoder *decoder_local;
  
  if ((decoder == (pt_event_decoder *)0x0) || (packet == (pt_packet_ip *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else {
    config = pt_evt_config(decoder);
    at._4_4_ = pt_last_ip_update_ip(&decoder->ip,packet,config);
    decoder_local._4_4_ = at._4_4_;
    if (-1 < at._4_4_) {
      ppVar1 = pt_evq_dequeue(&decoder->evq,2);
      if (ppVar1 == (pt_event *)0x0) {
        if (((byte)decoder->field_0x72c >> 5 & 1) == 0) {
          ppVar1 = pt_evq_standalone(&decoder->evq);
          decoder->event = ppVar1;
          if (ppVar1 == (pt_event *)0x0) {
            decoder_local._4_4_ = -1;
          }
          else {
            ppVar1->type = ptev_disabled;
            decoder_local._4_4_ =
                 pt_evt_event_ip(&(ppVar1->variant).disabled.ip,ppVar1,&decoder->ip);
            if ((-1 < decoder_local._4_4_) &&
               (decoder_local._4_4_ = pt_evt_event_time(ppVar1,&decoder->time),
               -1 < decoder_local._4_4_)) {
              decoder->field_0x72c = decoder->field_0x72c & 0xef;
              decoder_local._4_4_ = pt_evt_fetch_packet(decoder);
            }
          }
        }
        else {
          decoder_local._4_4_ = 1;
        }
      }
      else {
        decoder->event = ppVar1;
        switch(ppVar1->type) {
        case ptev_async_branch:
          ppVar1->type = ptev_async_disabled;
          (ppVar1->variant).enabled.ip = (ppVar1->variant).enabled.ip;
          at._4_4_ = pt_evt_event_ip(&(ppVar1->variant).async_disabled.ip,ppVar1,&decoder->ip);
          decoder->field_0x72c = decoder->field_0x72c & 0xef;
          decoder->field_0x72c = decoder->field_0x72c & 0xdf | 0x20;
          break;
        default:
          at._4_4_ = -6;
          break;
        case ptev_async_paging:
        case ptev_async_vmcs:
          if (((byte)decoder->field_0x72c >> 5 & 1) == 0) {
            return -1;
          }
        case ptev_exec_mode:
          ppVar1->field_0x4 = ppVar1->field_0x4 & 0xfe | 1;
        }
        if (at._4_4_ < 0) {
          decoder_local._4_4_ = at._4_4_;
        }
        else {
          decoder_local._4_4_ = pt_evt_event_time(ppVar1,&decoder->time);
        }
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_decode_tip_pgd(struct pt_event_decoder *decoder,
				 const struct pt_packet_ip *packet)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder || !packet)
		return -pte_internal;

	errcode = pt_last_ip_update_ip(&decoder->ip, packet,
				       pt_evt_config(decoder));
	if (errcode < 0)
		return errcode;

	ev = pt_evq_dequeue(&decoder->evq, evb_tip);
	if (!ev) {
		if (decoder->bound)
			return 1;

		decoder->event = ev = pt_evq_standalone(&decoder->evq);
		if (!ev)
			return -pte_internal;

		ev->type = ptev_disabled;

		errcode = pt_evt_event_ip(&ev->variant.disabled.ip, ev,
					  &decoder->ip);
		if (errcode < 0)
			return errcode;

		errcode = pt_evt_event_time(ev, &decoder->time);
		if (errcode < 0)
			return errcode;

		decoder->enabled = 0;

		return pt_evt_fetch_packet(decoder);
	}

	decoder->event = ev;

	switch (ev->type) {
	case ptev_async_branch: {
		uint64_t at;

		/* Turn the async branch into an async disable. */
		at = ev->variant.async_branch.from;

		ev->type = ptev_async_disabled;
		ev->variant.async_disabled.at = at;

		errcode = pt_evt_event_ip(&ev->variant.async_disabled.ip, ev,
					  &decoder->ip);

		decoder->enabled = 0;
		decoder->bound = 1;

		break;
	}

	case ptev_async_paging:
	case ptev_async_vmcs:
		/* The async paging and vmcs events are ordered after the async
		 * branch event that we turned into an async disable above.
		 */
		if (!decoder->bound)
			return -pte_internal;

		fallthrough;
	case ptev_exec_mode:
		/* The MODE.EXEC might come with a standalone TIP.PGD or with a
		 * FUP + TIP.PGD pair.  In both cases, we won't really reach
		 * the IP in the TIP.PGD's payload since tracing is disabled as
		 * part of the branch.  In the synchronous case, we won't get a
		 * TIP event that would allow us to reach the MODE.EXEC's event
		 * location.
		 *
		 * It is not quite clear what IP to give those events.
		 *
		 * If we give them the async disable's source IP, we'd make an
		 * error if the IP is updated when applying the async disable
		 * event.
		 *
		 * If we give them the async disable's destination IP, we'd make
		 * an error if the IP is not updated when applying the async
		 * disable event.  That's what our decoders do since tracing is
		 * likely to resume from there.
		 *
		 * In all cases, tracing will be disabled when those events are
		 * applied, so we may as well suppress the IP.
		 */
		ev->ip_suppressed = 1;
		break;

	default:
		errcode = -pte_bad_context;
		break;
	}

	if (errcode < 0)
		return errcode;

	return pt_evt_event_time(ev, &decoder->time);
}